

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

int AF_A_FreezeDeath(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  AActor *pAVar4;
  bool bVar5;
  bool local_76;
  bool local_73;
  TFlags<ActorFlag3,_unsigned_int> local_70;
  TFlags<ActorFlag,_unsigned_int> local_6c;
  FSoundID local_68;
  undefined1 local_64 [4];
  TFlags<ActorFlag2,_unsigned_int> local_60;
  TFlags<ActorFlag2,_unsigned_int> local_5c;
  undefined1 local_58 [4];
  TFlags<ActorFlag,_unsigned_int> local_54;
  TFlags<ActorFlag,_unsigned_int> local_50;
  int local_4c;
  void *pvStack_48;
  int t;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                  ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar5) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_73 = true;
    if (stateowner != (AActor *)0x0) {
      local_73 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_73 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                    ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar5 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar5 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar5 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar5) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                      ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_76 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_76 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_76 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                      ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar5 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar5 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar5 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar5) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                      ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      pvStack_48 = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      pvStack_48 = (void *)0x0;
    }
    local_4c = FRandom::operator()(&pr_freezedeath);
    iVar1 = local_4c + 0x4b;
    iVar2 = FRandom::operator()(&pr_freezedeath);
    stateowner->tics = iVar1 + iVar2;
    operator|((EnumType)local_58,MF_SOLID);
    TFlags<ActorFlag,_unsigned_int>::operator|(&local_54,(ActorFlag)local_58);
    TFlags<ActorFlag,_unsigned_int>::operator|(&local_50,(ActorFlag)&local_54);
    TFlags<ActorFlag,_unsigned_int>::operator|=(&stateowner->flags,&local_50);
    operator|((EnumType)local_64,MF2_PUSHABLE);
    TFlags<ActorFlag2,_unsigned_int>::operator|(&local_60,(ActorFlag2)local_64);
    TFlags<ActorFlag2,_unsigned_int>::operator|(&local_5c,(ActorFlag2)&local_60);
    TFlags<ActorFlag2,_unsigned_int>::operator|=(&stateowner->flags2,&local_5c);
    TFlags<ActorFlag3,_unsigned_int>::operator|=(&stateowner->flags3,MF3_CRASHED);
    pAVar4 = AActor::GetDefault(stateowner);
    stateowner->Height = pAVar4->Height;
    if ((3 < (stateowner->RenderStyle).field_0.BlendOp) &&
       ((stateowner->RenderStyle).field_0.BlendOp < 8)) {
      FRenderStyle::operator=((FRenderStyle *)&(stateowner->RenderStyle).field_0,STYLE_Normal);
    }
    pAVar4 = stateowner;
    FSoundID::FSoundID(&local_68,"misc/freeze");
    S_Sound(pAVar4,4,&local_68,1.0,1.0);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_6c,
               (int)stateowner + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
    if (uVar3 != 0) {
      stateowner->Alpha = 1.0;
      stateowner->visdir = '\0';
    }
    if (stateowner->player == (player_t *)0x0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_70,
                 (int)stateowner + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG)
                );
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
      bVar5 = false;
      if (uVar3 != 0) {
        bVar5 = stateowner->special != 0;
      }
      if (bVar5) {
        P_ExecuteSpecial(stateowner->special,(line_t *)0x0,stateowner,false,stateowner->args[0],
                         stateowner->args[1],stateowner->args[2],stateowner->args[3],
                         stateowner->args[4]);
        stateowner->special = 0;
      }
    }
    else {
      stateowner->player->damagecount = 0;
      stateowner->player->poisoncount = 0;
      stateowner->player->bonuscount = 0;
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeath)
{
	PARAM_ACTION_PROLOGUE;

	int t = pr_freezedeath();
	self->tics = 75+t+pr_freezedeath();
	self->flags |= MF_SOLID|MF_SHOOTABLE|MF_NOBLOOD|MF_ICECORPSE;
	self->flags2 |= MF2_PUSHABLE|MF2_TELESTOMP|MF2_PASSMOBJ|MF2_SLIDE;
	self->flags3 |= MF3_CRASHED;
	self->Height = self->GetDefault()->Height;
	// Remove fuzz effects from frozen actors.
	if (self->RenderStyle.BlendOp >= STYLEOP_Fuzz && self->RenderStyle.BlendOp <= STYLEOP_FuzzOrRevSub)
	{
		self->RenderStyle = STYLE_Normal;
	}

	S_Sound (self, CHAN_BODY, "misc/freeze", 1, ATTN_NORM);

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1;
		self->visdir = 0;
	}

	if (self->player)
	{
		self->player->damagecount = 0;
		self->player->poisoncount = 0;
		self->player->bonuscount = 0;
	}
	else if (self->flags3 & MF3_ISMONSTER && self->special)
	{ // Initiate monster death actions
		P_ExecuteSpecial(self->special, NULL, self, false, self->args[0],
			self->args[1], self->args[2], self->args[3], self->args[4]);
		self->special = 0;
	}
	return 0;
}